

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O3

void __thiscall
TEST_MockParameterTest_expectOneStringParameterAndValue_Test::testBody
          (TEST_MockParameterTest_expectOneStringParameterAndValue_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleString SStack_38;
  SimpleString local_28;
  SimpleString local_18;
  
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_18,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_18);
  SimpleString::SimpleString(&local_28,"parameter");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x98))
            ((long *)CONCAT44(extraout_var,iVar1),&local_28,"string");
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_18,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_18);
  SimpleString::SimpleString(&local_28,"parameter");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x78))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_28,"string");
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&SStack_38);
  return;
}

Assistant:

TEST(MockParameterTest, expectOneStringParameterAndValue)
{
    mock().expectOneCall("foo").withParameter("parameter", "string");
    mock().actualCall("foo").withParameter("parameter", "string");

    mock().checkExpectations();
}